

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_err_t flat_file_binary_search
                    (ion_flat_file_t *flat_file,ion_key_t target_key,ion_fpos_t *location)

{
  char cVar1;
  long location_00;
  bool bVar2;
  long local_78;
  ion_fpos_t dup_idx;
  ion_fpos_t last_dup_idx;
  char comp_result;
  ion_fpos_t mid_idx;
  ion_fpos_t high_idx;
  ion_fpos_t low_idx;
  ion_flat_file_row_t row;
  ion_err_t err;
  ion_fpos_t *location_local;
  ion_key_t target_key_local;
  ion_flat_file_t *flat_file_local;
  
  if (flat_file->sorted_mode == '\0') {
    return '\x14';
  }
  high_idx = 0;
  mid_idx = (ulong)(flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size - 1;
  if (mid_idx < 0) {
    *location = -1;
    return '\x01';
  }
  while (high_idx < mid_idx) {
    location_00 = high_idx + (mid_idx - high_idx) / 2;
    row.value._7_1_ = flat_file_read_row(flat_file,location_00,(ion_flat_file_row_t *)&low_idx);
    if (row.value._7_1_ != '\0') {
      return row.value._7_1_;
    }
    cVar1 = (*(flat_file->super).compare)
                      (target_key,(ion_key_t)row._0_8_,(flat_file->super).record.key_size);
    if (cVar1 < '\x01') {
      if (-1 < cVar1) {
        do {
          local_78 = location_00;
          location_00 = local_78 + -1;
          row.value._7_1_ =
               flat_file_read_row(flat_file,location_00,(ion_flat_file_row_t *)&low_idx);
          if (row.value._7_1_ != '\0') {
            return row.value._7_1_;
          }
          bVar2 = false;
          if (-1 < location_00) {
            cVar1 = (*(flat_file->super).compare)
                              ((ion_key_t)row._0_8_,target_key,(flat_file->super).record.key_size);
            bVar2 = cVar1 == '\0';
          }
        } while (bVar2);
        *location = local_78;
        return '\0';
      }
      mid_idx = location_00 + -1;
    }
    else {
      high_idx = location_00 + 1;
    }
  }
  row.value._7_1_ = flat_file_read_row(flat_file,high_idx,(ion_flat_file_row_t *)&low_idx);
  if (row.value._7_1_ != '\0') {
    return row.value._7_1_;
  }
  cVar1 = (*(flat_file->super).compare)
                    ((ion_key_t)row._0_8_,target_key,(flat_file->super).record.key_size);
  if ('\0' < cVar1) {
    high_idx = high_idx + -1;
  }
  *location = high_idx;
  return high_idx < 0;
}

Assistant:

ion_err_t
flat_file_binary_search(
	ion_flat_file_t *flat_file,
	ion_key_t		target_key,
	ion_fpos_t		*location
) {
	if (!flat_file->sorted_mode) {
		return err_sorted_order_violation;
	}

	ion_err_t			err;
	ion_flat_file_row_t row;
	ion_fpos_t			low_idx		= 0;
	ion_fpos_t			high_idx	= (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size - 1;
	ion_fpos_t			mid_idx;

	if (high_idx < 0) {
		/* We're empty, short circuit */
		*location = -1;
		return err_item_not_found;
	}

	while (low_idx < high_idx) {
		mid_idx = low_idx + (high_idx - low_idx) / 2;
		err		= flat_file_read_row(flat_file, mid_idx, &row);

		if (err_ok != err) {
			return err;
		}

		char comp_result = flat_file->super.compare(target_key, row.key, flat_file->super.record.key_size);

		if (comp_result > 0) {
			low_idx = mid_idx + 1;
		}
		else if (comp_result < 0) {
			high_idx = mid_idx - 1;
		}
		else {
			/* Match found, scroll to beginning of (potential) duplicate block and return */
			ion_fpos_t	last_dup_idx;
			ion_fpos_t	dup_idx = mid_idx;

			do {
				last_dup_idx	= dup_idx;
				dup_idx--;
				err				= flat_file_read_row(flat_file, dup_idx, &row);

				if (err_ok != err) {
					return err;
				}
			} while (dup_idx >= 0 && 0 == flat_file->super.compare(row.key, target_key, flat_file->super.record.key_size));

			*location = last_dup_idx;
			return err_ok;
		}
	}

	/* If we reach here, then we fell through the loop - do check and adjust for LEQ as necessary */
	err = flat_file_read_row(flat_file, low_idx, &row);

	if (err_ok != err) {
		return err;
	}

	if (flat_file->super.compare(row.key, target_key, flat_file->super.record.key_size) > 0) {
		low_idx--;
	}

	*location = low_idx;
	return low_idx >= 0 ? err_ok : err_item_not_found;
}